

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O0

int ApprovalTests::FileApprover::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  long *plVar1;
  __type_conflict1 _Var2;
  bool bVar3;
  byte bVar4;
  ostream *poVar5;
  runtime_error *this;
  undefined8 uVar6;
  stringstream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  ApprovalMissingException *in_stack_fffffffffffffdc0;
  string local_218 [24];
  string *in_stack_fffffffffffffe00;
  string local_1f8 [39];
  undefined1 local_1d1;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190;
  long *local_18;
  string *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_18 = (long *)siglen;
  local_10 = (string *)sig;
  local_8 = ctx;
  _Var2 = ::std::operator==(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (_Var2) {
    ::std::__cxx11::stringstream::stringstream(local_1a0);
    poVar5 = ::std::operator<<(&local_190,"Identical filenames for received and approved.\n");
    poVar5 = ::std::operator<<(poVar5,"Tests would spuriously pass. \n");
    poVar5 = ::std::operator<<(poVar5,"Please check your custom namer. \n");
    poVar5 = ::std::operator<<(poVar5,"Received : \"");
    poVar5 = ::std::operator<<(poVar5,(string *)local_8);
    poVar5 = ::std::operator<<(poVar5,"\" \n");
    poVar5 = ::std::operator<<(poVar5,"Approved : \"");
    poVar5 = ::std::operator<<(poVar5,local_10);
    ::std::operator<<(poVar5,"\"");
    local_1d1 = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringstream::str();
    ::std::runtime_error::runtime_error(this,local_1d0);
    local_1d1 = 0;
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar3 = FileUtils::fileExists(in_stack_fffffffffffffe00);
  if (!bVar3) {
    uVar6 = __cxa_allocate_exception(0x28);
    ApprovalMissingException::ApprovalMissingException
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    __cxa_throw(uVar6,&ApprovalMissingException::typeinfo,
                ApprovalMissingException::~ApprovalMissingException);
  }
  bVar3 = FileUtils::fileExists(in_stack_fffffffffffffe00);
  plVar1 = local_18;
  if (!bVar3) {
    uVar6 = __cxa_allocate_exception(0x28);
    ApprovalMissingException::ApprovalMissingException
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    __cxa_throw(uVar6,&ApprovalMissingException::typeinfo,
                ApprovalMissingException::~ApprovalMissingException);
  }
  ::std::__cxx11::string::string(local_1f8,(string *)local_8);
  ::std::__cxx11::string::string(local_218,local_10);
  bVar4 = (**(code **)(*plVar1 + 0x10))(plVar1,local_1f8,local_218);
  ::std::__cxx11::string::~string(local_218);
  uVar6 = ::std::__cxx11::string::~string(local_1f8);
  if (((bVar4 ^ 0xff) & 1) == 0) {
    return (uint)CONCAT71((int7)((ulong)uVar6 >> 8),bVar4) ^ 0xff;
  }
  uVar6 = __cxa_allocate_exception(0x28);
  ApprovalMismatchException::ApprovalMismatchException
            ((ApprovalMismatchException *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             in_stack_fffffffffffffdb0);
  __cxa_throw(uVar6,&ApprovalMismatchException::typeinfo,
              ApprovalMismatchException::~ApprovalMismatchException);
}

Assistant:

void FileApprover::verify(const std::string& receivedPath,
                              const std::string& approvedPath,
                              const ApprovalComparator& comparator)
    {
        if (receivedPath == approvedPath)
        {
            std::stringstream s;
            s << "Identical filenames for received and approved.\n"
              << "Tests would spuriously pass. \n"
              << "Please check your custom namer. \n"
              << "Received : \"" << receivedPath << "\" \n"
              << "Approved : \"" << approvedPath << "\"";
            // Do not throw ApprovalException, as we don't want reporters to trigger.
            // They would show two seemingly identical files, due to matching file name.
            throw std::runtime_error(s.str());
        }

        if (!FileUtils::fileExists(approvedPath))
        {
            throw ApprovalMissingException(receivedPath, approvedPath);
        }

        if (!FileUtils::fileExists(receivedPath))
        {
            throw ApprovalMissingException(approvedPath, receivedPath);
        }

        if (!comparator.contentsAreEquivalent(receivedPath, approvedPath))
        {
            throw ApprovalMismatchException(receivedPath, approvedPath);
        }
    }